

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_dec.c
# Opt level: O0

int ALPHInit(ALPHDecoder *dec,uint8_t *data,size_t data_size,VP8Io *src_io,uint8_t *output)

{
  int iVar1;
  int iVar2;
  ALPHDecoder *alph_dec;
  int *in_RCX;
  ulong in_RDX;
  byte *in_RSI;
  int *in_RDI;
  undefined8 in_R8;
  size_t alpha_decoded_size;
  VP8Io *io;
  int rsrv;
  size_t alpha_data_size;
  uint8_t *alpha_data;
  int ok;
  VP8Io *io_00;
  undefined4 in_stack_ffffffffffffffb0;
  uint local_34;
  uint local_4;
  
  alph_dec = (ALPHDecoder *)(in_RDX - 1);
  io_00 = (VP8Io *)(in_RDI + 8);
  VP8FiltersInit();
  *(undefined8 *)(in_RDI + 0x32) = in_R8;
  *in_RDI = *in_RCX;
  in_RDI[1] = in_RCX[1];
  if (in_RDX < 2) {
    local_4 = 0;
  }
  else {
    in_RDI[2] = *in_RSI & 3;
    in_RDI[3] = (int)(uint)*in_RSI >> 2 & 3;
    in_RDI[4] = (int)(uint)*in_RSI >> 4 & 3;
    iVar1 = (int)(uint)*in_RSI >> 6;
    if ((((in_RDI[2] < 0) || (1 < in_RDI[2])) || (3 < (uint)in_RDI[3])) ||
       ((1 < in_RDI[4] || (iVar1 != 0)))) {
      local_4 = 0;
    }
    else {
      iVar2 = VP8InitIo((VP8Io *)0x15b426);
      if (iVar2 == 0) {
        local_4 = 0;
      }
      else {
        WebPInitCustomIo((WebPDecParams *)0x0,io_00);
        io_00->opaque = in_RDI;
        io_00->width = *in_RCX;
        io_00->height = in_RCX[1];
        io_00->use_cropping = in_RCX[0x1d];
        io_00->crop_left = in_RCX[0x1e];
        io_00->crop_right = in_RCX[0x1f];
        io_00->crop_top = in_RCX[0x20];
        io_00->crop_bottom = in_RCX[0x21];
        if (in_RDI[2] == 0) {
          local_34 = (uint)((ALPHDecoder *)(long)(*in_RDI * in_RDI[1]) <= alph_dec);
        }
        else {
          local_34 = VP8LDecodeAlphaHeader
                               (alph_dec,(uint8_t *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
                                (size_t)io_00);
        }
        local_4 = local_34;
      }
    }
  }
  return local_4;
}

Assistant:

WEBP_NODISCARD static int ALPHInit(ALPHDecoder* const dec, const uint8_t* data,
                                   size_t data_size, const VP8Io* const src_io,
                                   uint8_t* output) {
  int ok = 0;
  const uint8_t* const alpha_data = data + ALPHA_HEADER_LEN;
  const size_t alpha_data_size = data_size - ALPHA_HEADER_LEN;
  int rsrv;
  VP8Io* const io = &dec->io;

  assert(data != NULL && output != NULL && src_io != NULL);

  VP8FiltersInit();
  dec->output = output;
  dec->width = src_io->width;
  dec->height = src_io->height;
  assert(dec->width > 0 && dec->height > 0);

  if (data_size <= ALPHA_HEADER_LEN) {
    return 0;
  }

  dec->method = (data[0] >> 0) & 0x03;
  dec->filter = (WEBP_FILTER_TYPE)((data[0] >> 2) & 0x03);
  dec->pre_processing = (data[0] >> 4) & 0x03;
  rsrv = (data[0] >> 6) & 0x03;
  if (dec->method < ALPHA_NO_COMPRESSION ||
      dec->method > ALPHA_LOSSLESS_COMPRESSION ||
      dec->filter >= WEBP_FILTER_LAST ||
      dec->pre_processing > ALPHA_PREPROCESSED_LEVELS ||
      rsrv != 0) {
    return 0;
  }

  // Copy the necessary parameters from src_io to io
  if (!VP8InitIo(io)) {
    return 0;
  }
  WebPInitCustomIo(NULL, io);
  io->opaque = dec;
  io->width = src_io->width;
  io->height = src_io->height;

  io->use_cropping = src_io->use_cropping;
  io->crop_left = src_io->crop_left;
  io->crop_right = src_io->crop_right;
  io->crop_top = src_io->crop_top;
  io->crop_bottom = src_io->crop_bottom;
  // No need to copy the scaling parameters.

  if (dec->method == ALPHA_NO_COMPRESSION) {
    const size_t alpha_decoded_size = dec->width * dec->height;
    ok = (alpha_data_size >= alpha_decoded_size);
  } else {
    assert(dec->method == ALPHA_LOSSLESS_COMPRESSION);
    ok = VP8LDecodeAlphaHeader(dec, alpha_data, alpha_data_size);
  }

  return ok;
}